

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O1

void __thiscall cfd::core::Block::Block(Block *this)

{
  this->_vptr_Block = (_func_int **)&PTR__Block_0069f8d8;
  ByteData::ByteData(&this->data_);
  (this->header_).version = 0;
  (this->header_).prev_block_hash._vptr_BlockHash = (_func_int **)&PTR__BlockHash_0068e010;
  ByteData::ByteData(&(this->header_).prev_block_hash.data_);
  (this->header_).merkle_root_hash._vptr_BlockHash = (_func_int **)&PTR__BlockHash_0068e010;
  ByteData::ByteData(&(this->header_).merkle_root_hash.data_);
  (this->header_).time = 0;
  (this->header_).bits = 0;
  (this->header_).nonce = 0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Block::Block() : data_() {
  // do nothing
}